

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_obj.c
# Opt level: O1

int backtracer_settracing(void *x,int tracing)

{
  int iVar1;
  _msgstack *p_Var2;
  
  p_Var2 = backtracer_stack;
  if (tracing == 0) {
    iVar1 = 0;
    post("backtrace:");
    for (; p_Var2 != (t_msgstack *)0x0; p_Var2 = p_Var2->m_next) {
      backtracer_printmsg(p_Var2->m_owner->b_owner,p_Var2->m_sel,p_Var2->m_argc,p_Var2->m_argv);
    }
    backtracer_tracing = 0;
  }
  else if (backtracer_tracing == 0) {
    backtracer_tracing = 1;
    iVar1 = 1;
  }
  else {
    iVar1 = 0;
    pd_error(x,"trace: already tracing");
  }
  return iVar1;
}

Assistant:

int backtracer_settracing(void *x, int tracing)
{
    if (tracing)
    {
        if (backtracer_tracing)
        {
            pd_error(x, "trace: already tracing");
            return (0);
        }
        else
        {
            backtracer_tracing = 1;
            return (1);
        }
    }
    else    /* when stopping, print backtrace to here */
    {
        t_msgstack *m = backtracer_stack;
        post("backtrace:");
        while (m)
        {
            backtracer_printmsg(m->m_owner->b_owner, m->m_sel,
                m->m_argc, m->m_argv);
            m = m->m_next;
        }
        backtracer_tracing = 0;
        return (0);
    }
}